

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathColorAlgo.h
# Opt level: O2

Color4<double> *
Imath_3_2::rgb2hsv<double>(Color4<double> *__return_storage_ptr__,Color4<double> *rgb)

{
  Color4<double> c;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  double local_28;
  double dStack_20;
  
  local_38 = rgb->r;
  dStack_30 = rgb->g;
  local_28 = rgb->b;
  dStack_20 = rgb->a;
  Imath_3_2::rgb2hsv_d((Color4 *)&local_58);
  __return_storage_ptr__->r = local_58;
  __return_storage_ptr__->g = dStack_50;
  __return_storage_ptr__->b = local_48;
  __return_storage_ptr__->a = dStack_40;
  return __return_storage_ptr__;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 Color4<T>
                                   rgb2hsv (const Color4<T>& rgb) IMATH_NOEXCEPT
{
    if (std::numeric_limits<T>::is_integer)
    {
        Color4<double> v = Color4<double> (
            rgb.r / float (std::numeric_limits<T>::max ()),
            rgb.g / float (std::numeric_limits<T>::max ()),
            rgb.b / float (std::numeric_limits<T>::max ()),
            rgb.a / float (std::numeric_limits<T>::max ()));
        Color4<double> c = rgb2hsv_d (v);
        return Color4<T> (
            (T) (c.r * std::numeric_limits<T>::max ()),
            (T) (c.g * std::numeric_limits<T>::max ()),
            (T) (c.b * std::numeric_limits<T>::max ()),
            (T) (c.a * std::numeric_limits<T>::max ()));
    }
    else
    {
        Color4<double> v = Color4<double> (rgb.r, rgb.g, rgb.b, rgb.a);
        Color4<double> c = rgb2hsv_d (v);
        return Color4<T> ((T) c.r, (T) c.g, (T) c.b, (T) c.a);
    }
}